

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall asmjit::Zone::Zone(Zone *this,uint32_t blockSize,uint32_t blockAlignment)

{
  uint32_t uVar1;
  
  this->_ptr = (uint8_t *)0x0;
  this->_end = (uint8_t *)0x0;
  this->_block = (Block *)Zone_zeroBlock;
  this->_blockSize = blockSize;
  uVar1 = 0;
  if ((int)blockAlignment < 0x10) {
    if (blockAlignment == 2) {
      uVar1 = 1;
    }
    else if (blockAlignment == 4) {
      uVar1 = 2;
    }
    else if (blockAlignment == 8) {
      uVar1 = 3;
    }
  }
  else if (blockAlignment == 0x10) {
    uVar1 = 4;
  }
  else if (blockAlignment == 0x20) {
    uVar1 = 5;
  }
  else if (blockAlignment == 0x40) {
    uVar1 = 6;
  }
  this->_blockAlignmentShift = uVar1;
  return;
}

Assistant:

Zone::Zone(uint32_t blockSize, uint32_t blockAlignment) noexcept
  : _ptr(nullptr),
    _end(nullptr),
    _block(const_cast<Zone::Block*>(&Zone_zeroBlock)),
    _blockSize(blockSize),
    _blockAlignmentShift(Zone_getAlignmentOffsetFromAlignment(blockAlignment)) {}